

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

shared_ptr<mocker::ir::Reg> __thiscall
mocker::ir::getDest(ir *this,shared_ptr<mocker::ir::IRInst> *inst)

{
  bool bVar1;
  element_type *this_00;
  shared_ptr<mocker::ir::Reg> *psVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mocker::ir::Reg> sVar3;
  undefined1 local_28 [8];
  shared_ptr<mocker::ir::Definition> def;
  shared_ptr<mocker::ir::IRInst> *inst_local;
  
  def.super___shared_ptr<mocker::ir::Definition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)inst;
  dyc<mocker::ir::Definition,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)local_28,inst);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
  if (bVar1) {
    this_00 = std::
              __shared_ptr_access<mocker::ir::Definition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<mocker::ir::Definition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_28);
    psVar2 = Definition::getDest(this_00);
    std::shared_ptr<mocker::ir::Reg>::shared_ptr((shared_ptr<mocker::ir::Reg> *)this,psVar2);
  }
  else {
    std::shared_ptr<mocker::ir::Reg>::shared_ptr((shared_ptr<mocker::ir::Reg> *)this,(nullptr_t)0x0)
    ;
  }
  std::shared_ptr<mocker::ir::Definition>::~shared_ptr
            ((shared_ptr<mocker::ir::Definition> *)local_28);
  sVar3.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ir::Reg>)
         sVar3.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Reg> getDest(const std::shared_ptr<IRInst> &inst) {
  auto def = dyc<Definition>(inst);
  if (!def)
    return nullptr;
  return def->getDest();
}